

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O1

QVariant * QVariant::fromMetaType(QVariant *__return_storage_ptr__,QMetaType type,void *copy)

{
  undefined1 *puVar1;
  ushort uVar2;
  uint uVar3;
  ulong uVar4;
  PrivateShared *pPVar5;
  void *__s;
  int iVar6;
  long in_FS_OFFSET;
  QMessageLogger local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
  *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
  if (type.d_ptr != (QMetaTypeInterface *)0x0) {
    if (((type.d_ptr)->typeId)._q_value.super___atomic_base<int>._M_i == 0) {
      QMetaType::registerHelper(type.d_ptr);
    }
    if ((type.d_ptr != (QMetaTypeInterface *)0x0) && ((type.d_ptr)->size != 0)) {
      if ((((type.d_ptr)->copyCtr == (CopyCtrFn)0x0) && (((type.d_ptr)->flags & 0x4000) != 0)) ||
         ((((type.d_ptr)->revision != 0 && ((type.d_ptr)->dtor == (DtorFn)0x0)) &&
          (((type.d_ptr)->flags & 2) != 0)))) {
        local_50.context.version = 2;
        local_50.context._4_8_ = 0;
        local_50.context._12_8_ = 0;
        local_50.context.function._4_4_ = 0;
        local_50.context.category = "default";
        QMessageLogger::warning
                  (&local_50,
                   "QVariant: Provided metatype for \'%s\' does not support destruction and copy construction"
                   ,(type.d_ptr)->name);
      }
      else if (((copy == (void *)0x0) && ((type.d_ptr)->defaultCtr == (DefaultCtrFn)0x0)) &&
              (((type.d_ptr)->flags & 1) != 0)) {
        local_50.context.version = 2;
        local_50.context._4_8_ = 0;
        local_50.context._12_8_ = 0;
        local_50.context.function._4_4_ = 0;
        local_50.context.category = "default";
        QMessageLogger::warning
                  (&local_50,"QVariant: Cannot create type \'%s\' without a default constructor",
                   (type.d_ptr)->name);
      }
      else {
        (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
        *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
        *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
        *(ulong *)&(__return_storage_ptr__->d).field_0x18 = (ulong)type.d_ptr & 0xfffffffffffffffc;
        if (copy == (void *)0x0) {
          uVar4 = 2;
        }
        else {
          uVar4 = (ulong)((uint)(((type.d_ptr)->typeId)._q_value.super___atomic_base<int>._M_i ==
                                0x33) * 2);
        }
        uVar4 = uVar4 | (ulong)type.d_ptr & 0xfffffffffffffffc;
        *(ulong *)&(__return_storage_ptr__->d).field_0x18 = uVar4;
        if (((((type.d_ptr)->flags & 4) == 0) || (uVar3 = (type.d_ptr)->size, 0x18 < uVar3)) ||
           (8 < (type.d_ptr)->alignment)) {
          uVar2 = (type.d_ptr)->alignment;
          uVar4 = 8;
          if (8 < (ulong)uVar2) {
            uVar4 = (ulong)uVar2;
          }
          pPVar5 = (PrivateShared *)operator_new(uVar4 + (type.d_ptr)->size);
          iVar6 = (-(uint)uVar2 & (int)pPVar5 + (uint)uVar2 + 7) - (int)pPVar5;
          __s = (void *)((long)&(pPVar5->ref).super_QAtomicInteger<int>.
                                super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>.
                                _M_i + (long)iVar6);
          (pPVar5->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int> = (__atomic_base<int>)0x1;
          pPVar5->offset = iVar6;
          if (copy == (void *)0x0) {
            if ((type.d_ptr)->defaultCtr == (DefaultCtrFn)0x0) {
              memset(__s,0,(ulong)(type.d_ptr)->size);
            }
            else {
              (*(type.d_ptr)->defaultCtr)(type.d_ptr,__s);
            }
          }
          else if ((type.d_ptr)->copyCtr == (CopyCtrFn)0x0) {
            memcpy(__s,copy,(ulong)(type.d_ptr)->size);
          }
          else {
            (*(type.d_ptr)->copyCtr)(type.d_ptr,__s,copy);
          }
          (__return_storage_ptr__->d).data.shared = pPVar5;
          puVar1 = &(__return_storage_ptr__->d).field_0x18;
          *puVar1 = *puVar1 | 1;
        }
        else {
          *(ulong *)&(__return_storage_ptr__->d).field_0x18 = uVar4;
          if (copy == (void *)0x0) {
            if ((type.d_ptr)->defaultCtr != (DefaultCtrFn)0x0) {
              (*(type.d_ptr)->defaultCtr)(type.d_ptr,__return_storage_ptr__);
            }
          }
          else {
            if ((type.d_ptr)->copyCtr == (CopyCtrFn)0x0) {
              if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
                __memcpy_chk(__return_storage_ptr__,copy,uVar3,0x20);
                return __return_storage_ptr__;
              }
              goto LAB_002d2773;
            }
            (*(type.d_ptr)->copyCtr)(type.d_ptr,__return_storage_ptr__,copy);
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
LAB_002d2773:
  __stack_chk_fail();
}

Assistant:

QVariant QVariant::fromMetaType(QMetaType type, const void *copy)
{
    QVariant result;
    type.registerType();
    const auto iface = type.iface();
    if (isValidMetaTypeForVariant(iface, copy)) {
        result.d = Private(iface);
        customConstruct(iface, &result.d, copy);
    }
    return result;
}